

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_option_function<unsigned_long>
          (App *this,string *option_name,function<void_(const_unsigned_long_&)> *func,
          string *option_description)

{
  Option *pOVar1;
  char *pcVar2;
  allocator local_101;
  string local_100;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_e0;
  string local_c0;
  callback_t local_a0;
  string local_70;
  Option *local_50;
  Option *opt;
  anon_class_32_1_898bcfc2 fun;
  string *option_description_local;
  function<void_(const_unsigned_long_&)> *func_local;
  string *option_name_local;
  App *this_local;
  
  fun.func._M_invoker = (_Invoker_type)option_description;
  _GLOBAL__N_1::std::function<void_(const_unsigned_long_&)>::function
            ((function<void_(const_unsigned_long_&)> *)&opt,func);
  std::__cxx11::string::string((string *)&local_70,(string *)option_name);
  std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::
  function<CLI::App::add_option_function<unsigned_long>(std::__cxx11::string,std::function<void(unsigned_long_const&)>const&,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)&local_a0,(anon_class_32_1_898bcfc2 *)&opt);
  std::__cxx11::string::string((string *)&local_c0,(string *)option_description);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function(&local_e0);
  pOVar1 = add_option(this,&local_70,&local_a0,&local_c0,false,&local_e0);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function(&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  _GLOBAL__N_1::std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  local_50 = pOVar1;
  pcVar2 = detail::type_name<unsigned_long,_(CLI::detail::enabler)0>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,pcVar2,&local_101);
  Option::type_name(pOVar1,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  Option::type_size(local_50,1,1);
  Option::expected(local_50,1);
  pOVar1 = local_50;
  add_option_function<unsigned_long>(std::__cxx11::string,std::function<void(unsigned_long_const&)>const&,std::__cxx11::string)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)#1}::
  ~vector((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const___1_
           *)&opt);
  return pOVar1;
}

Assistant:

Option *add_option_function(std::string option_name,
                                const std::function<void(const ArgType &)> &func,  ///< the callback to execute
                                std::string option_description = "") {

        auto fun = [func](const CLI::results_t &res) {
            ArgType variable;
            bool result = detail::lexical_conversion<ArgType, ArgType>(res, variable);
            if(result) {
                func(variable);
            }
            return result;
        };

        Option *opt = add_option(option_name, std::move(fun), option_description, false);
        opt->type_name(detail::type_name<ArgType>());
        opt->type_size(detail::type_count_min<ArgType>::value, detail::type_count<ArgType>::value);
        opt->expected(detail::expected_count<ArgType>::value);
        return opt;
    }